

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zeModuleDynamicLink
          (uint32_t numModules,ze_module_handle_t *phModules,ze_module_build_log_handle_t *phLinkLog
          )

{
  ze_pfnModuleDynamicLink_t p_Var1;
  ze_result_t zVar2;
  size_t i;
  ze_module_handle_t *pp_Var3;
  ulong uVar4;
  object_t<_ze_module_build_log_handle_t_*> *poVar5;
  dditable_t *dditable;
  dditable_t *local_38;
  
  local_38 = *(dditable_t **)(*phModules + 8);
  p_Var1 = (local_38->ze).Module.pfnDynamicLink;
  if (p_Var1 == (ze_pfnModuleDynamicLink_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    pp_Var3 = (ze_module_handle_t *)operator_new__((ulong)numModules * 8);
    for (uVar4 = 0; numModules != uVar4; uVar4 = uVar4 + 1) {
      pp_Var3[uVar4] = *(ze_module_handle_t *)phModules[uVar4];
    }
    zVar2 = (*p_Var1)(numModules,pp_Var3,phLinkLog);
    operator_delete__(pp_Var3);
    if (phLinkLog != (ze_module_build_log_handle_t *)0x0) {
      poVar5 = singleton_factory_t<object_t<_ze_module_build_log_handle_t*>,_ze_module_build_log_handle_t*>
               ::getInstance<_ze_module_build_log_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_module_build_log_handle_t*>,_ze_module_build_log_handle_t*>
                           *)(context + 0x4e0),phLinkLog,&local_38);
      *phLinkLog = (ze_module_build_log_handle_t)poVar5;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleDynamicLink(
        uint32_t numModules,                            ///< [in] number of modules to be linked pointed to by phModules.
        ze_module_handle_t* phModules,                  ///< [in][range(0, numModules)] pointer to an array of modules to
                                                        ///< dynamically link together.
        ze_module_build_log_handle_t* phLinkLog         ///< [out][optional] pointer to handle of dynamic link log.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_module_object_t*>( phModules[ 0 ] )->dditable;
        auto pfnDynamicLink = dditable->ze.Module.pfnDynamicLink;
        if( nullptr == pfnDynamicLink )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handles to driver handles
        auto phModulesLocal = new ze_module_handle_t [numModules];
        for( size_t i = 0; ( nullptr != phModules ) && ( i < numModules ); ++i )
            phModulesLocal[ i ] = reinterpret_cast<ze_module_object_t*>( phModules[ i ] )->handle;

        // forward to device-driver
        result = pfnDynamicLink( numModules, phModulesLocal, phLinkLog );
        delete []phModulesLocal;

        try
        {
            // convert driver handle to loader handle
            if( nullptr != phLinkLog )
                *phLinkLog = reinterpret_cast<ze_module_build_log_handle_t>(
                    context->ze_module_build_log_factory.getInstance( *phLinkLog, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        if( ZE_RESULT_SUCCESS != result )
            return result;

        return result;
    }